

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChEnumMapper<chrono::ChForce::ReferenceFrame>::AddMapping
          (ChEnumMapper<chrono::ChForce::ReferenceFrame> *this,char *name,ReferenceFrame enumid)

{
  ChEnumNamePair<chrono::ChForce::ReferenceFrame> mpair;
  ChEnumNamePair<chrono::ChForce::ReferenceFrame> CStack_38;
  
  ChEnumNamePair<chrono::ChForce::ReferenceFrame>::ChEnumNamePair(&CStack_38,name,enumid);
  std::
  vector<chrono::ChEnumNamePair<chrono::ChForce::ReferenceFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::ReferenceFrame>_>_>
  ::push_back((this->enummap).
              super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::ReferenceFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::ReferenceFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr,&CStack_38);
  std::__cxx11::string::~string((string *)&CStack_38);
  return;
}

Assistant:

void AddMapping(const char* name, Te enumid) {
        ChEnumNamePair<Te> mpair (name, enumid);
        enummap->push_back(mpair);
    }